

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void colmajor_to_rowmajor<double,unsigned_long>
               (double *Xc,unsigned_long *Xc_ind,unsigned_long *Xc_indptr,size_t nrows,size_t ncols,
               vector<double,_std::allocator<double>_> *Xr,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *Xr_ind,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *Xr_indptr)

{
  reference pvVar1;
  reference pvVar2;
  ulong in_RCX;
  long in_RDX;
  unsigned_long *in_RSI;
  long in_RDI;
  ulong in_R8;
  vector<double,_std::allocator<double>_> *in_R9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000008;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000010;
  size_t row;
  size_t ix_2;
  size_t curr_n;
  size_t curr_row;
  size_t ix_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> argsorted_indices;
  unsigned_long ix;
  size_t col;
  vector<unsigned_long,_std::allocator<unsigned_long>_> row_indices;
  size_t nnz;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffeb8;
  value_type vVar3;
  unsigned_long in_stack_fffffffffffffec0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffec8;
  long lVar4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffed0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffed8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffee0;
  ulong local_e8;
  size_type local_e0;
  value_type local_d8;
  value_type local_d0;
  size_type local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  ulong local_78;
  ulong local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  ulong local_38;
  vector<double,_std::allocator<double>_> *local_30;
  ulong local_28;
  ulong local_20;
  long local_18;
  unsigned_long *local_10;
  long local_8;
  
  local_38 = *(ulong *)(in_RDX + in_R8 * 8);
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x3b41a2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffee0._M_current,(size_type)in_stack_fffffffffffffed8._M_current,
             (allocator_type *)in_stack_fffffffffffffed0._M_current);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x3b41c8);
  for (local_70 = 0; local_70 < local_28; local_70 = local_70 + 1) {
    for (local_78 = *(ulong *)(local_18 + local_70 * 8);
        local_78 < *(ulong *)(local_18 + 8 + local_70 * 8); local_78 = local_78 + 1) {
      vVar3 = local_10[local_78];
      pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_50,local_78);
      *pvVar1 = vVar3;
    }
  }
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x3b42d1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffee0._M_current,(size_type)in_stack_fffffffffffffed8._M_current,
             (allocator_type *)in_stack_fffffffffffffed0._M_current);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x3b42f7);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_fffffffffffffeb8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffffeb8);
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_fffffffffffffeb8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffffeb8);
  std::
  stable_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,colmajor_to_rowmajor<double,unsigned_long>(double_const*,unsigned_long_const*,unsigned_long_const*,unsigned_long,unsigned_long,std::vector<double,std::allocator<double>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&)::_lambda(unsigned_long,unsigned_long)_1_>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
             (anon_class_8_1_37759ca2)in_stack_fffffffffffffed0._M_current);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee0._M_current,
             (size_type)in_stack_fffffffffffffed8._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffee0._M_current,(size_type)in_stack_fffffffffffffed8._M_current);
  for (local_c8 = 0; local_c8 < local_38; local_c8 = local_c8 + 1) {
    lVar4 = local_8;
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_90,local_c8);
    in_stack_fffffffffffffed0._M_current = *(unsigned_long **)(lVar4 + *pvVar1 * 8);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_30,local_c8);
    *pvVar2 = (value_type)in_stack_fffffffffffffed0._M_current;
    in_stack_fffffffffffffed8._M_current = local_10;
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_90,local_c8);
    in_stack_fffffffffffffee0._M_current =
         (unsigned_long *)in_stack_fffffffffffffed8._M_current[*pvVar1];
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_stack_00000008,local_c8);
    *pvVar1 = (value_type)in_stack_fffffffffffffee0._M_current;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffee0._M_current,(size_type)in_stack_fffffffffffffed8._M_current);
  local_d0 = 0;
  local_d8 = 0;
  for (local_e0 = 0; local_e0 < local_38; local_e0 = local_e0 + 1) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_90,local_e0);
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_50,*pvVar1);
    if (*pvVar1 == local_d0) {
      local_d8 = local_d8 + 1;
    }
    else {
      pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_stack_00000010,local_d0 + 1);
      *pvVar1 = local_d8;
      local_d8 = 0;
      pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_90,local_e0);
      pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_50,*pvVar1);
      local_d0 = *pvVar1;
    }
  }
  for (local_e8 = 1; local_e8 < local_20; local_e8 = local_e8 + 1) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_stack_00000010,local_e8);
    vVar3 = *pvVar1;
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_stack_00000010,local_e8 + 1);
    *pvVar1 = vVar3 + *pvVar1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffed0._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffed0._M_current);
  return;
}

Assistant:

void colmajor_to_rowmajor(const real_t *restrict Xc, const sparse_ix *restrict Xc_ind, const sparse_ix *restrict Xc_indptr,
                          size_t nrows, size_t ncols,
                          std::vector<double> &Xr, std::vector<size_t> &Xr_ind, std::vector<size_t> &Xr_indptr)
{
    /* First convert to COO */
    size_t nnz = Xc_indptr[ncols];
    std::vector<size_t> row_indices(nnz);
    for (size_t col = 0; col < ncols; col++)
    {
        for (sparse_ix ix = Xc_indptr[col]; ix < Xc_indptr[col+1]; ix++)
        {
            row_indices[ix] = Xc_ind[ix];
        }
    }

    /* Then copy the data argsorted by rows */
    std::vector<size_t> argsorted_indices(nnz);
    std::iota(argsorted_indices.begin(), argsorted_indices.end(), (size_t)0);
    std::stable_sort(argsorted_indices.begin(), argsorted_indices.end(),
                     [&row_indices](const size_t a, const size_t b)
                     {return row_indices[a] < row_indices[b];});
    Xr.resize(nnz);
    Xr_ind.resize(nnz);
    for (size_t ix = 0; ix < nnz; ix++)
    {
        Xr[ix] = Xc[argsorted_indices[ix]];
        Xr_ind[ix] = Xc_ind[argsorted_indices[ix]];
    }

    /* Now build the index pointer */
    Xr_indptr.resize(nrows+1);
    size_t curr_row = 0;
    size_t curr_n = 0;
    for (size_t ix = 0; ix < nnz; ix++)
    {
        if (row_indices[argsorted_indices[ix]] != curr_row)
        {
            Xr_indptr[curr_row+1] = curr_n;
            curr_n = 0;
            curr_row = row_indices[argsorted_indices[ix]];
        }

        else
        {
            curr_n++;
        }
    }
    for (size_t row = 1; row < nrows; row++)
        Xr_indptr[row+1] += Xr_indptr[row];
}